

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_prov_cipher.c
# Opt level: O3

int cipher_set_ctx_params(void *vgctx,OSSL_PARAM *params)

{
  int iVar1;
  long lVar2;
  ASN1_TYPE *type;
  uint uVar3;
  ASN1_TYPE *a;
  size_t derlen;
  size_t taglen;
  uchar *der;
  uchar **local_438;
  undefined8 local_430;
  uchar *local_428 [129];
  
  lVar2 = OSSL_PARAM_locate_const(params,"alg_id_param");
  if (lVar2 != 0) {
    local_428[0] = (uchar *)0x0;
    local_438 = (uchar **)0x0;
    iVar1 = OSSL_PARAM_get_octet_string_ptr();
    uVar3 = 0;
    a = (ASN1_TYPE *)0x0;
    if (iVar1 != 0) {
      type = d2i_ASN1_TYPE((ASN1_TYPE **)0x0,local_428,(long)local_438);
      uVar3 = 0;
      a = (ASN1_TYPE *)0x0;
      if (type != (ASN1_TYPE *)0x0) {
        iVar1 = EVP_CIPHER_asn1_to_param(*(EVP_CIPHER_CTX **)((long)vgctx + 0x20),type);
        uVar3 = (uint)(0 < iVar1);
        a = type;
      }
    }
    ASN1_TYPE_free(a);
    return uVar3;
  }
  lVar2 = OSSL_PARAM_locate_const(params,"padding");
  if (lVar2 != 0) {
    local_428[0] = (uchar *)((ulong)local_428[0] & 0xffffffff00000000);
    iVar1 = OSSL_PARAM_get_uint(lVar2);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = EVP_CIPHER_CTX_set_padding(*(EVP_CIPHER_CTX **)((long)vgctx + 0x20),(int)local_428[0]);
    if (iVar1 < 1) {
      return 0;
    }
  }
  lVar2 = OSSL_PARAM_locate_const(params,"key-mesh");
  if (lVar2 != 0) {
    local_428[0] = (uchar *)0x0;
    iVar1 = OSSL_PARAM_get_size_t(lVar2);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = EVP_CIPHER_CTX_ctrl(*(EVP_CIPHER_CTX **)((long)vgctx + 0x20),0x20,(int)local_428[0],
                                (void *)0x0);
    if (iVar1 < 1) {
      return 0;
    }
  }
  lVar2 = OSSL_PARAM_locate_const(params,"ivlen");
  if (lVar2 != 0) {
    local_428[0] = (uchar *)0x0;
    iVar1 = OSSL_PARAM_get_size_t(lVar2);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = EVP_CIPHER_CTX_ctrl(*(EVP_CIPHER_CTX **)((long)vgctx + 0x20),9,(int)local_428[0],
                                (void *)0x0);
    if (iVar1 < 1) {
      return 0;
    }
  }
  lVar2 = OSSL_PARAM_locate_const(params,"tag");
  if (lVar2 == 0) {
    return 1;
  }
  local_438 = local_428;
  local_430 = 0;
  iVar1 = OSSL_PARAM_get_octet_string(lVar2,&local_438,0x400);
  if (iVar1 != 0) {
    iVar1 = EVP_CIPHER_CTX_ctrl(*(EVP_CIPHER_CTX **)((long)vgctx + 0x20),0x11,(int)local_430,
                                local_428);
    if (0 < iVar1) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static int cipher_set_ctx_params(void *vgctx, const OSSL_PARAM params[])
{
    GOST_CTX *gctx = vgctx;
    const OSSL_PARAM *p;

    if ((p = OSSL_PARAM_locate_const(params, "alg_id_param")) != NULL) {
        ASN1_TYPE *algidparam = NULL;
        const unsigned char *der = NULL;
        size_t derlen = 0;
        int ret;

        ret = OSSL_PARAM_get_octet_string_ptr(p, (const void **)&der, &derlen)
            && (algidparam = d2i_ASN1_TYPE(NULL, &der, (long)derlen)) != NULL
            && EVP_CIPHER_asn1_to_param(gctx->cctx, algidparam) > 0;

        ASN1_TYPE_free(algidparam);
        return ret;
    }
    if ((p = OSSL_PARAM_locate_const(params, "padding")) != NULL) {
        unsigned int pad = 0;

        if (!OSSL_PARAM_get_uint(p, &pad)
            || EVP_CIPHER_CTX_set_padding(gctx->cctx, pad) <= 0)
            return 0;
    }
    if ((p = OSSL_PARAM_locate_const(params, "key-mesh")) != NULL) {
        size_t key_mesh = 0;

        if (!OSSL_PARAM_get_size_t(p, &key_mesh)
            || EVP_CIPHER_CTX_ctrl(gctx->cctx, EVP_CTRL_KEY_MESH,
                                   key_mesh, NULL) <= 0)
            return 0;
    }
    if ((p = OSSL_PARAM_locate_const(params, OSSL_CIPHER_PARAM_IVLEN)) != NULL) {
        size_t ivlen = 0;

        if (!OSSL_PARAM_get_size_t(p, &ivlen)
            || EVP_CIPHER_CTX_ctrl(gctx->cctx, EVP_CTRL_AEAD_SET_IVLEN,
                                   ivlen, NULL) <= 0)
            return 0;
    }
    if ((p = OSSL_PARAM_locate_const(params, OSSL_CIPHER_PARAM_AEAD_TAG)) != NULL) {
        char tag[1024];
        void *val = (void *) tag;
        size_t taglen = 0;

        if (!OSSL_PARAM_get_octet_string(p, &val, 1024, &taglen)
            || EVP_CIPHER_CTX_ctrl(gctx->cctx, EVP_CTRL_AEAD_SET_TAG,
                                   taglen, &tag) <= 0)
            return 0;
    }
    return 1;
}